

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::writeNonHcfs(ClaspAppBase *this,PrgDepGraph *graph)

{
  uint __fd;
  uint32 uVar1;
  size_type sVar2;
  int iVar3;
  SharedContext *this_00;
  ImpGraphRef __buf;
  Solver *pSVar4;
  DBRef this_01;
  const_reference ppCVar5;
  undefined4 extraout_var;
  LitVec *this_02;
  size_t in_RCX;
  size_t __n;
  void *__buf_00;
  void *__buf_01;
  ulong uVar7;
  uint32 i_1;
  ClauseHead *x;
  uint32 i;
  DBRef db;
  SharedContext *ctx;
  WriteCnf cnf;
  NonHcfIter end;
  NonHcfIter it;
  StringBuilder buf;
  uint32 in_stack_fffffffffffffe78;
  uint32 in_stack_fffffffffffffe7c;
  SharedContext *in_stack_fffffffffffffe80;
  Solver *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffe9c;
  WriteCnf *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeac;
  size_type local_cc;
  uint local_bc;
  string local_a8 [32];
  WriteCnf local_88;
  NonHcfIter local_70;
  NonHcfIter local_58;
  StringBuilder local_50;
  ulong uVar6;
  
  Potassco::StringBuilder::StringBuilder((StringBuilder *)0x117d24);
  local_58 = Asp::PrgDepGraph::nonHcfBegin((PrgDepGraph *)0x117d31);
  local_70 = Asp::PrgDepGraph::nonHcfEnd((PrgDepGraph *)0x117d58);
  for (; local_58 != local_70; local_58 = local_58 + 1) {
    uVar1 = Asp::PrgDepGraph::NonHcfComponent::id(*local_58);
    Potassco::StringBuilder::appendFormat(&local_50,".%u",(ulong)uVar1);
    Potassco::StringBuilder::c_str((StringBuilder *)in_stack_fffffffffffffe90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (char *)in_stack_fffffffffffffea0);
    WriteCnf::WriteCnf(in_stack_fffffffffffffea0,
                       (string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    std::__cxx11::string::~string(local_a8);
    this_00 = Asp::PrgDepGraph::NonHcfComponent::ctx(*local_58);
    SharedContext::numVars((SharedContext *)0x117e67);
    SharedContext::numConstraints(in_stack_fffffffffffffe80);
    WriteCnf::writeHeader
              ((WriteCnf *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe78);
    uVar1 = SharedContext::numVars((SharedContext *)0x117ea4);
    __buf = SharedContext::shortImplications(this_00);
    uVar7 = (ulong)uVar1;
    WriteCnf::write(&local_88,uVar1,__buf,in_RCX);
    pSVar4 = SharedContext::master((SharedContext *)0x117ee3);
    this_01 = Solver::constraints(pSVar4);
    local_bc = 0;
    while( true ) {
      sVar2 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                        (this_01);
      __n = (size_t)sVar2;
      if (local_bc == sVar2) break;
      uVar7 = (ulong)local_bc;
      ppCVar5 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                operator[](this_01,local_bc);
      iVar3 = (*(*ppCVar5)->_vptr_Constraint[9])();
      uVar6 = CONCAT44(extraout_var,iVar3);
      if (uVar6 != 0) {
        WriteCnf::write(&local_88,iVar3,__buf_00,__n);
        uVar7 = uVar6;
      }
      local_bc = local_bc + 1;
    }
    local_cc = 0;
    while( true ) {
      iVar3 = (int)uVar7;
      in_stack_fffffffffffffeac = local_cc;
      pSVar4 = SharedContext::master((SharedContext *)0x118045);
      in_stack_fffffffffffffea0 = (WriteCnf *)Solver::trail(pSVar4);
      in_stack_fffffffffffffe9c =
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                      in_stack_fffffffffffffea0);
      in_RCX = (size_t)in_stack_fffffffffffffe9c;
      if (in_stack_fffffffffffffeac == in_stack_fffffffffffffe9c) break;
      in_stack_fffffffffffffe90 = SharedContext::master((SharedContext *)0x118086);
      this_02 = Solver::trail(in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe80 =
           (SharedContext *)
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                     (this_02,local_cc);
      __fd = (uint)(in_stack_fffffffffffffe80->satPrepro).ptr_;
      uVar7 = (ulong)__fd;
      WriteCnf::write(&local_88,__fd,__buf_01,in_RCX);
      local_cc = local_cc + 1;
    }
    WriteCnf::close(&local_88,iVar3);
    Potassco::StringBuilder::clear((StringBuilder *)0x11810e);
    WriteCnf::~WriteCnf((WriteCnf *)in_stack_fffffffffffffe80);
  }
  Potassco::StringBuilder::~StringBuilder((StringBuilder *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void ClaspAppBase::writeNonHcfs(const PrgDepGraph& graph) const {
	Potassco::StringBuilder buf;
	for (PrgDepGraph::NonHcfIter it = graph.nonHcfBegin(), end = graph.nonHcfEnd(); it != end; ++it) {
		buf.appendFormat(".%u", (*it)->id());
		WriteCnf cnf(claspAppOpts_.hccOut + buf.c_str());
		const SharedContext& ctx = (*it)->ctx();
		cnf.writeHeader(ctx.numVars(), ctx.numConstraints());
		cnf.write(ctx.numVars(), ctx.shortImplications());
		Solver::DBRef db = ctx.master()->constraints();
		for (uint32 i = 0; i != db.size(); ++i) {
			if (ClauseHead* x = db[i]->clause()) { cnf.write(x); }
		}
		for (uint32 i = 0; i != ctx.master()->trail().size(); ++i) {
			cnf.write(ctx.master()->trail()[i]);
		}
		cnf.close();
		buf.clear();
	}
}